

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::iterate
          (ConcurrentImageAtomicCase *this)

{
  int *value;
  int *value_00;
  pointer *ppuVar1;
  pointer *this_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  GLint GVar6;
  deUint32 dVar7;
  uint uVar8;
  undefined4 extraout_var;
  MessageBuilder *pMVar10;
  undefined4 extraout_var_00;
  void *__src;
  TestError *pTVar11;
  int callNdx_1;
  ulong uVar12;
  deUint32 sumValue;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int callNdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  int invalidOperationNdx;
  Functions *local_208;
  Buffer resultBuffer;
  deUint32 errorExpected;
  deUint32 errorDelta;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainDelta;
  vector<int,_std::allocator<int>_> deltas;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  Functions *pFVar9;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar9 = (Functions *)CONCAT44(extraout_var,iVar4);
  iVar4 = this->m_numCalls;
  sumValue = ((iVar4 + 1) * iVar4) / 2;
  deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  generateShuffledRamp(iVar4,&deltas);
  zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
  std::operator<<((ostream *)ppuVar1,"Clearing image contents");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&zeroData,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  (*pFVar9->useProgram)((this->m_imageClearProgram->m_program).m_program);
  (*pFVar9->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88b9,0x8236);
  (*pFVar9->dispatchCompute)(this->m_workSize,this->m_workSize,1);
  (*pFVar9->memoryBarrier)(0x20);
  GVar5 = (*pFVar9->getError)();
  glu::checkError(GVar5,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xaae);
  GVar6 = (*pFVar9->getUniformLocation)((this->m_program->m_program).m_program,"u_atomicDelta");
  zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_208 = pFVar9;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
  std::operator<<((ostream *)ppuVar1,"Running shader ");
  value = &this->m_numCalls;
  pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)&zeroData,value);
  std::operator<<((ostream *)&pMVar10->m_str," times.\n");
  std::operator<<((ostream *)&pMVar10->m_str,"Num groups = (");
  value_00 = &this->m_workSize;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value_00);
  std::operator<<((ostream *)&pMVar10->m_str,", ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,value_00);
  std::operator<<((ostream *)&pMVar10->m_str,", 1)\n");
  std::operator<<((ostream *)&pMVar10->m_str,
                  "Setting u_atomicDelta to a unique value for each call.\n");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  pFVar9 = local_208;
  if (GVar6 == -1) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&zeroData,"u_atomicDelta location was -1",(allocator<char> *)&resultBuffer)
    ;
    tcu::TestError::TestError(pTVar11,(string *)&zeroData);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*local_208->useProgram)((this->m_program->m_program).m_program);
  (*pFVar9->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88ba,0x8236);
  pFVar9 = local_208;
  ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar15 = 0;
  for (lVar13 = 0; lVar13 < *value; lVar13 = lVar13 + 1) {
    zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
    std::operator<<((ostream *)ppuVar1,"Call ");
    std::ostream::operator<<(ppuVar1,(int)lVar13);
    std::operator<<((ostream *)ppuVar1,": u_atomicDelta = ");
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&zeroData,
                         (int *)((long)deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar15));
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
    (*pFVar9->uniform1ui)
              (GVar6,*(GLuint *)
                      ((long)deltas.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar15));
    (*pFVar9->bindBufferBase)
              (0x90d2,1,*(GLuint *)
                         ((long)(this->m_intermediateResultBuffers).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar15));
    (*pFVar9->dispatchCompute)(*value_00,*value_00,1);
    lVar15 = lVar15 + 4;
  }
  GVar5 = (*local_208->getError)();
  glu::checkError(GVar5,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xace);
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
  std::operator<<((ostream *)ppuVar1,"Verifying work image, it should be filled with value ");
  std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&zeroData,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var_00,iVar4);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&resultBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&zeroData,(long)(*value_00 * *value_00),(value_type_conflict2 *)&chainDelta,
             (allocator_type *)&invalidOperationNdx);
  (**(code **)(lVar13 + 0x40))(0x90d2,resultBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar13 + 0x150))
            (0x90d2,(long)(*value_00 * *value_00 * 4),
             zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88ea);
  (**(code **)(lVar13 + 0xdb8))(0x20);
  (**(code **)(lVar13 + 0x1680))((this->m_imageReadProgram->m_program).m_program);
  (**(code **)(lVar13 + 0x48))(0x90d2,1,resultBuffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar13 + 0x80))(2,this->m_imageID,0,0,0,35000,0x8236);
  (**(code **)(lVar13 + 0x528))(*value_00,*value_00,1);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"read",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xb40);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  __src = (void *)(**(code **)(lVar13 + 0xd00))(0x90d2,0,(long)(*value_00 * *value_00 * 4),1);
  dVar7 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar7,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xb46);
  if (__src == (void *)0x0) {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&zeroData,"mapBufferRange returned NULL",(allocator<char> *)&chainDelta);
    tcu::TestError::TestError(pTVar11,(string *)&zeroData);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&result,(long)(*value_00 * *value_00));
  memcpy(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,__src,(long)*value_00 * (long)*value_00 * 4);
  cVar2 = (**(code **)(lVar13 + 0x1670))(0x90d2);
  if (cVar2 == '\0') {
    pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&zeroData,"unmapBuffer returned false",(allocator<char> *)&chainDelta);
    tcu::TestError::TestError(pTVar11,(string *)&zeroData);
    __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::ObjectWrapper::~ObjectWrapper(&resultBuffer.super_ObjectWrapper);
  uVar8 = *value_00 * *value_00;
  uVar12 = 0;
  uVar14 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar14 = uVar12;
  }
  for (lVar13 = 0; uVar14 * 4 != lVar13; lVar13 = lVar13 + 4) {
    iVar4 = (int)uVar12;
    if (*(deUint32 *)
         ((long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar13) != sumValue) {
      zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
      std::operator<<((ostream *)ppuVar1,"Work image error, at index (");
      std::ostream::operator<<(ppuVar1,iVar4 % *value_00);
      std::operator<<((ostream *)ppuVar1,", ");
      std::ostream::operator<<(ppuVar1,iVar4 / *value_00);
      std::operator<<((ostream *)ppuVar1,") expected value ");
      std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
      std::operator<<((ostream *)ppuVar1,", got ");
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&zeroData,
                           (uint *)(lVar13 + (long)result.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
      std::operator<<((ostream *)&pMVar10->m_str,"\n");
      std::operator<<((ostream *)&pMVar10->m_str,"Work image contains invalid values.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image contents invalid");
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      goto LAB_00496494;
    }
    uVar12 = (ulong)(iVar4 + 1);
  }
  zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
  std::operator<<((ostream *)ppuVar1,"Work image contents are valid.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&zeroData,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&resultBuffer,(long)*value,(allocator_type *)&zeroData);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&result,(long)*value,(allocator_type *)&zeroData);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&chainDelta,(long)*value,(allocator_type *)&zeroData);
  zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
  std::operator<<((ostream *)ppuVar1,"Verifying intermediate results. ");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&zeroData,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
  pFVar9 = local_208;
  lVar13 = 0;
  for (lVar15 = 0; lVar15 < *value; lVar15 = lVar15 + 1) {
    (*pFVar9->bindBuffer)
              (0x90d2,(this->m_intermediateResultBuffers).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15]);
    readBuffer(pFVar9,0x90d2,*value_00 * *value_00,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(resultBuffer.super_ObjectWrapper.m_gl)->activeShaderProgram + lVar13));
    lVar13 = lVar13 + 0x18;
  }
  ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  uVar14 = 0;
  do {
    if ((long)*value_00 <= (long)uVar14) {
      zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
      std::operator<<((ostream *)ppuVar1,"Intermediate buffers are valid.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&zeroData,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&resultBuffer);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
LAB_00496494:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&deltas.super__Vector_base<int,_std::allocator<int>_>);
      return STOP;
    }
    pFVar9 = resultBuffer.super_ObjectWrapper.m_gl;
    for (lVar13 = 0; lVar13 < *value; lVar13 = lVar13 + 1) {
      result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar13] = *(uint *)(pFVar9->activeShaderProgram + uVar14 * 4)
      ;
      pFVar9 = (Functions *)&pFVar9->beginConditionalRender;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    uVar12 = 0;
    while ((long)uVar12 < (long)*value) {
      dVar7 = sumValue;
      if (uVar12 + 1 != (ulong)(uint)*value) {
        dVar7 = result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12 + 1];
      }
      *(deUint32 *)
       (CONCAT44(chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + uVar12 * 4) =
           dVar7 - result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
      uVar12 = uVar12 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (CONCAT44(chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_),
               chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    bVar3 = validateSortedAtomicRampAdditionValueChain
                      (&result,sumValue,&invalidOperationNdx,&errorDelta,&errorExpected);
    if (!bVar3) {
      zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"Intermediate buffer error, at index (");
      uVar8 = (int)uVar14 >> 0x1f;
      std::ostream::operator<<
                (this_00,(int)((long)((ulong)uVar8 << 0x20 | uVar14 & 0xffffffff) % (long)*value_00)
                );
      std::operator<<((ostream *)this_00,", ");
      std::ostream::operator<<
                (this_00,(int)((long)((ulong)uVar8 << 0x20 | uVar14 & 0xffffffff) / (long)*value_00)
                );
      std::operator<<((ostream *)this_00,"), applied operation index ");
      std::ostream::operator<<(this_00,invalidOperationNdx);
      std::operator<<((ostream *)this_00,", value was increased by ");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,", but expected ");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,".\n");
      std::operator<<((ostream *)this_00,
                      "Intermediate buffer contains invalid values. Values at index (");
      std::ostream::operator<<
                (this_00,(int)((long)((ulong)uVar8 << 0x20 | uVar14 & 0xffffffff) % (long)*value_00)
                );
      std::operator<<((ostream *)this_00,", ");
      std::ostream::operator<<
                (this_00,(int)((long)((ulong)uVar8 << 0x20 | uVar14 & 0xffffffff) / (long)*value_00)
                );
      std::operator<<((ostream *)this_00,")\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&zeroData,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      lVar13 = 0;
      for (lVar15 = 0; lVar15 < *value; lVar15 = lVar15 + 1) {
        zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
        std::operator<<((ostream *)ppuVar1,"Value[");
        std::ostream::operator<<(ppuVar1,(int)lVar15);
        std::operator<<((ostream *)ppuVar1,"] = ");
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&zeroData,
                             (uint *)(*(long *)((long)&(resultBuffer.super_ObjectWrapper.m_gl)->
                                                       activeShaderProgram + lVar13) + uVar14 * 4));
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
        lVar13 = lVar13 + 0x18;
      }
      zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppuVar1 = &zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
      std::operator<<((ostream *)ppuVar1,"Result = ");
      std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&zeroData,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Buffer contents invalid");
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&chainDelta.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&resultBuffer);
      goto LAB_00496494;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

TestCase::IterateResult ConcurrentImageAtomicCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			sumValue		= (deUint32)(m_numCalls * (m_numCalls + 1) / 2);
	std::vector<int>		deltas;

	// generate unique deltas
	generateShuffledRamp(m_numCalls, deltas);

	// clear image
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Clearing image contents" << tcu::TestLog::EndMessage;

		gl.useProgram(m_imageClearProgram->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		gl.dispatchCompute(m_workSize, m_workSize, 1);
		gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");
	}

	// invoke program N times, each with a different delta
	{
		const int deltaLocation = gl.getUniformLocation(m_program->getProgram(), "u_atomicDelta");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running shader " << m_numCalls << " times.\n"
			<< "Num groups = (" << m_workSize << ", " << m_workSize << ", 1)\n"
			<< "Setting u_atomicDelta to a unique value for each call.\n"
			<< tcu::TestLog::EndMessage;

		if (deltaLocation == -1)
			throw tcu::TestError("u_atomicDelta location was -1");

		gl.useProgram(m_program->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Call " << callNdx << ": u_atomicDelta = " << deltas[callNdx]
				<< tcu::TestLog::EndMessage;

			gl.uniform1ui(deltaLocation, deltas[callNdx]);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_intermediateResultBuffers[callNdx]);
			gl.dispatchCompute(m_workSize, m_workSize, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		std::vector<deUint32> result;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work image, it should be filled with value " << sumValue << tcu::TestLog::EndMessage;

		readWorkImage(result);

		for (int ndx = 0; ndx < m_workSize * m_workSize; ++ndx)
		{
			if (result[ndx] != sumValue)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Work image error, at index (" << ndx % m_workSize << ", " << ndx / m_workSize << ") expected value " << (sumValue) << ", got " << result[ndx] << "\n"
					<< "Work image contains invalid values."
					<< tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Work image contents are valid." << tcu::TestLog::EndMessage;
	}

	// verify steps
	{
		std::vector<std::vector<deUint32> >	intermediateResults	(m_numCalls);
		std::vector<deUint32>				valueChain			(m_numCalls);
		std::vector<deUint32>				chainDelta			(m_numCalls);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying intermediate results. " << tcu::TestLog::EndMessage;

		// collect results

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffers[callNdx]);
			readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_workSize * m_workSize, intermediateResults[callNdx]);
		}

		// verify values

		for (int valueNdx = 0; valueNdx < m_workSize; ++valueNdx)
		{
			int			invalidOperationNdx;
			deUint32	errorDelta;
			deUint32	errorExpected;

			// collect result chain for each element
			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				valueChain[callNdx] = intermediateResults[callNdx][valueNdx];

			// check there exists a path from 0 to sumValue using each addition once
			// decompose cumulative results to addition operations (all additions positive => this works)

			std::sort(valueChain.begin(), valueChain.end());

			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				chainDelta[callNdx] = ((callNdx + 1 == m_numCalls) ? (sumValue) : (valueChain[callNdx+1])) - valueChain[callNdx];

			// chainDelta contains now the actual additions applied to the value
			std::sort(chainDelta.begin(), chainDelta.end());

			// validate chain
			if (!validateSortedAtomicRampAdditionValueChain(valueChain, sumValue, invalidOperationNdx, errorDelta, errorExpected))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Intermediate buffer error, at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << "), applied operation index "
					<< invalidOperationNdx << ", value was increased by " << errorDelta << ", but expected " << errorExpected << ".\n"
					<< "Intermediate buffer contains invalid values. Values at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << ")\n"
					<< tcu::TestLog::EndMessage;

				for (int logCallNdx = 0; logCallNdx < m_numCalls; ++logCallNdx)
					m_testCtx.getLog() << tcu::TestLog::Message << "Value[" << logCallNdx << "] = " << intermediateResults[logCallNdx][valueNdx] << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Message << "Result = " << sumValue << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Intermediate buffers are valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}